

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

int __thiscall
kj::HttpHeaders::clone(HttpHeaders *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  bool bVar1;
  StringPtr *this_00;
  ArrayPtr<const_char> *pAVar2;
  size_t sVar3;
  unsigned_long *puVar4;
  Header *pHVar5;
  Range<unsigned_long> RVar6;
  ArrayPtr<const_char> AVar7;
  unsigned_long i_1;
  Iterator __end1_1;
  Iterator __begin1_1;
  Range<unsigned_long> *__range1_1;
  unsigned_long i;
  Iterator __end1;
  Iterator __begin1;
  Range<unsigned_long> local_38;
  Range<unsigned_long> *local_28;
  Range<unsigned_long> *__range1;
  __fn *local_18;
  HttpHeaders *this_local;
  HttpHeaders *result;
  
  __range1._7_1_ = 0;
  local_18 = __fn;
  this_local = this;
  HttpHeaders(this,*(HttpHeaderTable **)__fn);
  local_38 = indices<kj::Array<kj::StringPtr>const&>((Array<kj::StringPtr> *)(__fn + 8));
  local_28 = &local_38;
  __end1 = Range<unsigned_long>::begin(local_28);
  i = (unsigned_long)Range<unsigned_long>::end(local_28);
  while( true ) {
    bVar1 = Range<unsigned_long>::Iterator::operator!=(&__end1,(Iterator *)&i);
    if (!bVar1) break;
    puVar4 = Range<unsigned_long>::Iterator::operator*(&__end1);
    sVar3 = *puVar4;
    this_00 = Array<kj::StringPtr>::operator[]((Array<kj::StringPtr> *)(__fn + 8),sVar3);
    bVar1 = StringPtr::operator!=(this_00,(void *)0x0);
    if (bVar1) {
      pAVar2 = &Array<kj::StringPtr>::operator[]((Array<kj::StringPtr> *)(__fn + 8),sVar3)->content;
      AVar7 = (ArrayPtr<const_char>)cloneToOwn(this,(StringPtr)*pAVar2);
      pAVar2 = &Array<kj::StringPtr>::operator[](&this->indexedHeaders,sVar3)->content;
      *pAVar2 = AVar7;
    }
    Range<unsigned_long>::Iterator::operator++(&__end1);
  }
  sVar3 = Vector<kj::HttpHeaders::Header>::size((Vector<kj::HttpHeaders::Header> *)(__fn + 0x20));
  Vector<kj::HttpHeaders::Header>::resize(&this->unindexedHeaders,sVar3);
  RVar6 = indices<kj::Vector<kj::HttpHeaders::Header>const&>
                    ((Vector<kj::HttpHeaders::Header> *)(__fn + 0x20));
  __begin1_1.value = RVar6.begin_;
  __end1_1 = Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin1_1);
  i_1 = (unsigned_long)Range<unsigned_long>::end((Range<unsigned_long> *)&__begin1_1);
  while( true ) {
    bVar1 = Range<unsigned_long>::Iterator::operator!=(&__end1_1,(Iterator *)&i_1);
    if (!bVar1) break;
    puVar4 = Range<unsigned_long>::Iterator::operator*(&__end1_1);
    sVar3 = *puVar4;
    pHVar5 = Vector<kj::HttpHeaders::Header>::operator[]
                       ((Vector<kj::HttpHeaders::Header> *)(__fn + 0x20),sVar3);
    AVar7 = (ArrayPtr<const_char>)cloneToOwn(this,(StringPtr)(pHVar5->name).content);
    pHVar5 = Vector<kj::HttpHeaders::Header>::operator[](&this->unindexedHeaders,sVar3);
    (pHVar5->name).content = AVar7;
    pHVar5 = Vector<kj::HttpHeaders::Header>::operator[]
                       ((Vector<kj::HttpHeaders::Header> *)(__fn + 0x20),sVar3);
    AVar7 = (ArrayPtr<const_char>)cloneToOwn(this,(StringPtr)(pHVar5->value).content);
    pHVar5 = Vector<kj::HttpHeaders::Header>::operator[](&this->unindexedHeaders,sVar3);
    (pHVar5->value).content = AVar7;
    Range<unsigned_long>::Iterator::operator++(&__end1_1);
  }
  return (int)this;
}

Assistant:

HttpHeaders HttpHeaders::clone() const {
  HttpHeaders result(*table);

  for (auto i: kj::indices(indexedHeaders)) {
    if (indexedHeaders[i] != nullptr) {
      result.indexedHeaders[i] = result.cloneToOwn(indexedHeaders[i]);
    }
  }

  result.unindexedHeaders.resize(unindexedHeaders.size());
  for (auto i: kj::indices(unindexedHeaders)) {
    result.unindexedHeaders[i].name = result.cloneToOwn(unindexedHeaders[i].name);
    result.unindexedHeaders[i].value = result.cloneToOwn(unindexedHeaders[i].value);
  }

  return result;
}